

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSC.cpp
# Opt level: O1

void __thiscall CSC::CSC(CSC *this,int r,int c,int nnz,int *p,int *d,double *v)

{
  int *__s;
  int *__s_00;
  double *__s_01;
  uint uVar1;
  ulong uVar2;
  ulong __n;
  
  this->row = r;
  this->col = c;
  this->nonzero = nnz;
  uVar2 = (long)c * 4 + 4;
  if (c < -1) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  this->ptr = __s;
  uVar2 = (long)nnz * 4;
  if (nnz < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __n = (long)nnz * 8;
  if (nnz < 0) {
    __n = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(uVar2);
  memset(__s_00,0,uVar2);
  this->idx = __s_00;
  __s_01 = (double *)operator_new__(__n);
  memset(__s_01,0,__n);
  this->val = __s_01;
  if (-1 < this->col) {
    uVar2 = 0;
    if (0 < this->col) {
      uVar2 = (ulong)(uint)this->col;
    }
    memcpy(__s,p,uVar2 * 4 + 4);
  }
  uVar1 = this->nonzero;
  if (0 < (int)uVar1) {
    uVar1 = this->nonzero;
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    memcpy(__s_00,d,uVar2 << 2);
  }
  if (0 < (int)uVar1) {
    memcpy(__s_01,v,(ulong)uVar1 << 3);
    return;
  }
  return;
}

Assistant:

CSC::CSC(int r, int c, int nnz, int *p, int *d, double *v)
{
    row = r;
    col = c;
    nonzero = nnz;
    ptr = new int[col+1]();
    idx = new int[nonzero]();
    val = new double [nonzero]();

    for (int i = 0; i < col+1; ++i)
    {
      ptr[i] = p[i];
    }
    for (int i = 0; i < nonzero; ++i)
    {
        idx[i] = d[i];
    }
    for (int i = 0; i < nonzero; ++i)
    {
        val[i] = v[i];
    }

 }